

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_arrayresize(HSQUIRRELVM v,SQInteger idx,SQInteger newsize)

{
  bool bVar1;
  SQRESULT SVar2;
  SQObjectPtr *arr;
  SQObjectPtr *local_20;
  
  if (v->_stackbase < v->_top) {
    bVar1 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&local_20);
    SVar2 = -1;
    if (bVar1) {
      if (newsize < 0) {
        sq_throwerror(v,"negative size");
      }
      else {
        SQArray::Resize((local_20->super_SQObject)._unVal.pArray,newsize);
        SVar2 = 0;
      }
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar2 = -1;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_arrayresize(HSQUIRRELVM v,SQInteger idx,SQInteger newsize)
{
    sq_aux_paramscheck(v,1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(newsize >= 0) {
        _array(*arr)->Resize(newsize);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("negative size"));
}